

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Statistics::~Statistics(Statistics *this)

{
  (**this->readingTime->_vptr_Timer)();
  (**this->solvingTime->_vptr_Timer)();
  (**this->preprocessingTime->_vptr_Timer)();
  (**this->simplexTime->_vptr_Timer)();
  (**this->syncTime->_vptr_Timer)();
  (**this->transformTime->_vptr_Timer)();
  (**this->rationalTime->_vptr_Timer)();
  (**this->initialPrecisionTime->_vptr_Timer)();
  (**this->extendedPrecisionTime->_vptr_Timer)();
  (**this->reconstructionTime->_vptr_Timer)();
  (**this->boostingStepTime->_vptr_Timer)();
  free(this->readingTime);
  this->readingTime = (Timer *)0x0;
  free(this->solvingTime);
  this->solvingTime = (Timer *)0x0;
  free(this->preprocessingTime);
  this->preprocessingTime = (Timer *)0x0;
  free(this->simplexTime);
  this->simplexTime = (Timer *)0x0;
  free(this->syncTime);
  this->syncTime = (Timer *)0x0;
  free(this->transformTime);
  this->transformTime = (Timer *)0x0;
  free(this->rationalTime);
  this->rationalTime = (Timer *)0x0;
  free(this->initialPrecisionTime);
  this->initialPrecisionTime = (Timer *)0x0;
  free(this->extendedPrecisionTime);
  this->extendedPrecisionTime = (Timer *)0x0;
  free(this->reconstructionTime);
  this->reconstructionTime = (Timer *)0x0;
  free(this->boostingStepTime);
  this->boostingStepTime = (Timer *)0x0;
  return;
}

Assistant:

~Statistics()
   {
      // we need to free all timers again (allocation happens in constructor)
      readingTime->~Timer();
      solvingTime->~Timer();
      preprocessingTime->~Timer();
      simplexTime->~Timer();
      syncTime->~Timer();
      transformTime->~Timer();
      rationalTime->~Timer();
      initialPrecisionTime->~Timer();
      extendedPrecisionTime->~Timer();
      reconstructionTime->~Timer();
      boostingStepTime->~Timer();
      spx_free(readingTime);
      spx_free(solvingTime);
      spx_free(preprocessingTime);
      spx_free(simplexTime);
      spx_free(syncTime);
      spx_free(transformTime);
      spx_free(rationalTime);
      spx_free(initialPrecisionTime);
      spx_free(extendedPrecisionTime);
      spx_free(reconstructionTime);
      spx_free(boostingStepTime);
   }